

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long value,
          format_specs *specs)

{
  int value_00;
  void *in_RDX;
  pointer_writer<unsigned_long> *in_RSI;
  format_specs *in_RDI;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *unaff_retaddr;
  format_specs specs_copy;
  pointer_writer<unsigned_long> pw;
  int num_digits;
  basic_writer<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffa0;
  format_specs *specs_00;
  
  specs_00 = in_RDI;
  value_00 = count_digits<4u,unsigned_long>((unsigned_long)in_RSI);
  if (in_RDX == (void *)0x0) {
    to_unsigned<int>(value_00);
    reserve(in_stack_ffffffffffffffa0,(size_t)in_RDI);
    basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>::operator()
              ((pointer_writer<unsigned_long> *)in_stack_ffffffffffffffa0,(wchar_t **)in_RDI);
  }
  else {
    memcpy(&stack0xffffffffffffffa4,in_RDX,0x24);
    basic_writer<fmt::v6::buffer_range<wchar_t>>::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
              (unaff_retaddr,specs_00,in_RSI);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }